

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.h
# Opt level: O2

void __thiscall BayesianGameBase::SetProbability(BayesianGameBase *this,Index i,double p)

{
  double local_20;
  sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
  local_18;
  
  if (this[8] == (BayesianGameBase)0x1) {
    local_18.i_ = (size_type)i;
    local_18.
    super_container_reference<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
    .c_ = (container_type *)(this + 0x28);
    local_20 = p;
    boost::numeric::ublas::
    sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
    ::set(&local_18,&local_20);
  }
  else {
    *(double *)(*(long *)(this + 0x10) + (ulong)i * 8) = p;
  }
  return;
}

Assistant:

void SetProbability(Index i, double p)
        { if(_m_useSparse) _m_jTypeProbsSparse[i]=p;
            else _m_jTypeProbs[i]=p;}